

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi32 SyOctalStrToInt64(char *zSrc,sxu32 nLen,void *pOutVal,char **zRest)

{
  byte bVar1;
  ushort *puVar2;
  int iVar3;
  ushort *in_RAX;
  ushort **ppuVar4;
  byte *pbVar5;
  ushort *puVar6;
  byte *pbVar7;
  byte *pbVar8;
  byte *pbVar9;
  byte *pbVar10;
  bool bVar11;
  
  pbVar10 = (byte *)(zSrc + nLen);
  if (nLen != 0) {
    ppuVar4 = __ctype_b_loc();
    in_RAX = *ppuVar4;
    do {
      bVar1 = *zSrc;
      if ((*(byte *)((long)in_RAX + (long)(char)bVar1 * 2 + 1) & 0x20) == 0) {
        in_RAX = (ushort *)(ulong)bVar1;
        if ((bVar1 == 0x2b) || (bVar1 == 0x2d)) {
          bVar11 = bVar1 == 0x2d;
          goto LAB_0011bec0;
        }
        break;
      }
      zSrc = (char *)((byte *)zSrc + 1);
    } while (zSrc < pbVar10);
  }
  bVar11 = false;
  for (; (zSrc < pbVar10 && (*zSrc == 0x30)); zSrc = (char *)((byte *)zSrc + 1)) {
LAB_0011bec0:
  }
  if (zSrc < pbVar10) {
    ppuVar4 = __ctype_b_loc();
    puVar2 = *ppuVar4;
    in_RAX = (ushort *)0x0;
    puVar6 = (ushort *)0x0;
    pbVar5 = (byte *)zSrc;
    do {
      bVar1 = ((byte *)zSrc)[(long)in_RAX];
      if (((*(byte *)((long)puVar2 + (long)(char)bVar1 * 2 + 1) & 8) == 0) || ('7' < (char)bVar1))
      break;
      puVar6 = (ushort *)((long)(char)bVar1 + (long)puVar6 * 8 + -0x30);
      pbVar7 = (byte *)zSrc + (long)in_RAX + 1;
      pbVar9 = pbVar5 + 1;
      if (pbVar10 <= pbVar7) goto LAB_0011bfe8;
      bVar1 = *pbVar7;
      if ((((*(byte *)((long)puVar2 + (long)(char)bVar1 * 2 + 1) & 8) == 0) ||
          (iVar3 = (int)in_RAX, pbVar9 = pbVar7, 0x14 < iVar3 + 1)) || ('7' < (char)bVar1))
      goto LAB_0011bfe8;
      puVar6 = (ushort *)((long)(char)bVar1 + (long)puVar6 * 8 + -0x30);
      pbVar7 = pbVar5 + 2;
      pbVar8 = (byte *)zSrc + (long)in_RAX + 2;
      pbVar9 = pbVar7;
      if (pbVar10 <= pbVar8) goto LAB_0011bfe8;
      bVar1 = *pbVar8;
      pbVar9 = pbVar8;
      if ((((*(byte *)((long)puVar2 + (long)(char)bVar1 * 2 + 1) & 8) == 0) ||
          (pbVar9 = pbVar7, 0x14 < iVar3 + 2)) || ('7' < (char)bVar1)) goto LAB_0011bfe8;
      puVar6 = (ushort *)((long)(char)bVar1 + (long)puVar6 * 8 + -0x30);
      pbVar7 = (byte *)zSrc + (long)in_RAX + 3;
      pbVar9 = pbVar5 + 3;
      if (pbVar10 <= pbVar7) goto LAB_0011bfe8;
      bVar1 = *pbVar7;
      if ((((*(byte *)((long)puVar2 + (long)(char)bVar1 * 2 + 1) & 8) == 0) ||
          (pbVar9 = pbVar7, 0x14 < iVar3 + 3)) || ('7' < (char)bVar1)) goto LAB_0011bfe8;
      puVar6 = (ushort *)((long)(char)bVar1 + (long)puVar6 * 8 + -0x30);
      pbVar5 = pbVar5 + 4;
      pbVar9 = (byte *)zSrc + (long)in_RAX;
      in_RAX = in_RAX + 2;
    } while (pbVar9 + 4 < pbVar10);
    pbVar9 = (byte *)zSrc + (long)in_RAX;
  }
  else {
    puVar6 = (ushort *)0x0;
    pbVar9 = (byte *)zSrc;
  }
LAB_0011bfe8:
  if (pbVar9 < pbVar10) {
    ppuVar4 = __ctype_b_loc();
    in_RAX = *ppuVar4;
    bVar1 = *(byte *)((long)in_RAX + (long)(char)*pbVar9 * 2 + 1);
    while (((bVar1 & 0x20) != 0 && (pbVar9 = pbVar9 + 1, pbVar9 < pbVar10))) {
      bVar1 = *(byte *)((long)in_RAX + (long)(char)*pbVar9 * 2 + 1);
    }
  }
  if (pOutVal != (void *)0x0) {
    in_RAX = (ushort *)-(long)puVar6;
    if (puVar6 == (ushort *)0x0) {
      in_RAX = puVar6;
    }
    if (!bVar11) {
      in_RAX = puVar6;
    }
    *(ushort **)pOutVal = in_RAX;
  }
  return (sxi32)in_RAX;
}

Assistant:

JX9_PRIVATE sxi32 SyOctalStrToInt64(const char *zSrc, sxu32 nLen, void * pOutVal, const char **zRest)
{
	const char *zIn, *zEnd;
	int isNeg = FALSE;
	sxi64 nVal = 0;
	int c;
#if defined(UNTRUST)
	if( SX_EMPTY_STR(zSrc) ){
		if( pOutVal ){
			*(sxi32 *)pOutVal = 0;
		}
		return SXERR_EMPTY;
	}
#endif
	zEnd = &zSrc[nLen];
	while(zSrc < zEnd && SyisSpace(zSrc[0]) ){
		zSrc++;
	}
	if( zSrc < zEnd && ( zSrc[0] == '-' || zSrc[0] == '+' ) ){
		isNeg = (zSrc[0] == '-') ? TRUE :FALSE;
		zSrc++;
	}
	/* Skip leading zero */
	while(zSrc < zEnd && zSrc[0] == '0' ){
		zSrc++; 
	}
	zIn = zSrc;
	for(;;){
		if(zSrc >= zEnd || !SyisDigit(zSrc[0])){ break; } if( (c=zSrc[0]-'0') > 7 || (int)(zSrc-zIn) > 20){ break;} nVal = nVal * 8 +  c; zSrc++;
		if(zSrc >= zEnd || !SyisDigit(zSrc[0])){ break; } if( (c=zSrc[0]-'0') > 7 || (int)(zSrc-zIn) > 20){ break;} nVal = nVal * 8 +  c; zSrc++;
		if(zSrc >= zEnd || !SyisDigit(zSrc[0])){ break; } if( (c=zSrc[0]-'0') > 7 || (int)(zSrc-zIn) > 20){ break;} nVal = nVal * 8 +  c; zSrc++;
		if(zSrc >= zEnd || !SyisDigit(zSrc[0])){ break; } if( (c=zSrc[0]-'0') > 7 || (int)(zSrc-zIn) > 20){ break;} nVal = nVal * 8 +  c; zSrc++;
	}
	/* Skip trailing spaces */
	while(zSrc < zEnd && SyisSpace(zSrc[0])){
		zSrc++;
	}
	if( zRest ){
		*zRest = zSrc;
	}	
	if( pOutVal ){
		if( isNeg == TRUE && nVal != 0 ){
			nVal = -nVal;
		}
		*(sxi64 *)pOutVal = nVal;
	}
	return (zSrc >= zEnd) ? SXRET_OK : SXERR_SYNTAX;
}